

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
EncodeAttributesEncoderIdentifier
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          int32_t att_encoder_id)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  MeshEncoder *this_00;
  char cVar4;
  int in_ESI;
  long *in_RDI;
  uchar *unaff_retaddr;
  EncoderBuffer *in_stack_00000008;
  int32_t att_id;
  MeshTraversalMethod traversal_method;
  int32_t element_type;
  int8_t att_data_id;
  undefined1 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe1;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  int iVar5;
  MeshAttributeElementType local_14;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x35),(long)in_ESI);
  cVar4 = (char)*pvVar2;
  PointCloudEncoder::buffer((PointCloudEncoder *)in_RDI[1]);
  EncoderBuffer::Encode<signed_char>(in_stack_00000008,(char *)unaff_retaddr);
  local_14 = MESH_VERTEX_ATTRIBUTE;
  if (-1 < cVar4) {
    pvVar3 = std::
             vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
             ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
                           *)(in_RDI + 0x32),(long)cVar4);
    iVar5 = pvVar3->attribute_index;
    this_00 = (MeshEncoder *)(**(code **)(*in_RDI + 0x50))();
    MeshEncoder::mesh(this_00);
    local_14 = Mesh::GetAttributeElementType
                         ((Mesh *)CONCAT44(iVar5,CONCAT13(in_stack_ffffffffffffffe3,
                                                          CONCAT12(in_stack_ffffffffffffffe2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffffe1,
                                                  in_stack_ffffffffffffffe0)))),
                          (int)((ulong)in_RDI >> 0x20));
    std::
    vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
    ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
                  *)(in_RDI + 0x32),(long)cVar4);
  }
  if (local_14 == MESH_VERTEX_ATTRIBUTE) {
LAB_0019f9f0:
    PointCloudEncoder::buffer((PointCloudEncoder *)in_RDI[1]);
    EncoderBuffer::Encode<unsigned_char>(in_stack_00000008,unaff_retaddr);
  }
  else {
    if (local_14 == MESH_CORNER_ATTRIBUTE) {
      pvVar3 = std::
               vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
               ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
                             *)(in_RDI + 0x32),(long)cVar4);
      bVar1 = MeshAttributeCornerTable::no_interior_seams(&pvVar3->connectivity_data);
      if (bVar1) goto LAB_0019f9f0;
    }
    PointCloudEncoder::buffer((PointCloudEncoder *)in_RDI[1]);
    EncoderBuffer::Encode<unsigned_char>(in_stack_00000008,unaff_retaddr);
  }
  PointCloudEncoder::buffer((PointCloudEncoder *)in_RDI[1]);
  EncoderBuffer::Encode<unsigned_char>(in_stack_00000008,unaff_retaddr);
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::
    EncodeAttributesEncoderIdentifier(int32_t att_encoder_id) {
  const int8_t att_data_id = attribute_encoder_to_data_id_map_[att_encoder_id];
  encoder_->buffer()->Encode(att_data_id);

  // Also encode the type of the encoder that we used.
  int32_t element_type = MESH_VERTEX_ATTRIBUTE;
  MeshTraversalMethod traversal_method;
  if (att_data_id >= 0) {
    const int32_t att_id = attribute_data_[att_data_id].attribute_index;
    element_type = GetEncoder()->mesh()->GetAttributeElementType(att_id);
    traversal_method = attribute_data_[att_data_id].traversal_method;
  } else {
    traversal_method = pos_traversal_method_;
  }
  if (element_type == MESH_VERTEX_ATTRIBUTE ||
      (element_type == MESH_CORNER_ATTRIBUTE &&
       attribute_data_[att_data_id].connectivity_data.no_interior_seams())) {
    // Per-vertex encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_VERTEX_ATTRIBUTE));
  } else {
    // Per-corner encoder.
    encoder_->buffer()->Encode(static_cast<uint8_t>(MESH_CORNER_ATTRIBUTE));
  }
  // Encode the mesh traversal method.
  encoder_->buffer()->Encode(static_cast<uint8_t>(traversal_method));
  return true;
}